

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

shared_ptr<Map_Item> __thiscall Map::GetItem(Map *this,short uid)

{
  long lVar1;
  short sVar2;
  World *pWVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined6 in_register_00000032;
  long *plVar4;
  long *plVar5;
  shared_ptr<Map_Item> sVar6;
  
  plVar5 = *(long **)(CONCAT62(in_register_00000032,uid) + 0x68);
  plVar4 = (long *)(CONCAT62(in_register_00000032,uid) + 0x68);
  if (plVar5 != plVar4) {
    sVar2 = (short)in_RDX._M_pi;
    do {
      pWVar3 = (World *)plVar5[2];
      this->world = pWVar3;
      lVar1 = plVar5[3];
      this->id = (short)lVar1;
      this->rid[0] = (char)((ulong)lVar1 >> 0x10);
      this->rid[1] = (char)((ulong)lVar1 >> 0x18);
      this->rid[2] = (char)((ulong)lVar1 >> 0x20);
      this->rid[3] = (char)((ulong)lVar1 >> 0x28);
      this->pk = (bool)(char)((ulong)lVar1 >> 0x30);
      this->field_0xf = (char)((ulong)lVar1 >> 0x38);
      if (lVar1 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
          UNLOCK();
          pWVar3 = this->world;
        }
        else {
          *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        }
      }
      if ((short)pWVar3->last_character_id == sVar2) goto LAB_001674f2;
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->id !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->id);
        in_RDX._M_pi = extraout_RDX;
      }
      plVar5 = (long *)*plVar5;
    } while (plVar5 != plVar4);
  }
  this->world = (World *)0x0;
  this->id = 0;
  this->rid[0] = '\0';
  this->rid[1] = '\0';
  this->rid[2] = '\0';
  this->rid[3] = '\0';
  this->pk = false;
  this->field_0xf = 0;
LAB_001674f2:
  sVar6.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar6.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Map_Item>)sVar6.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Map_Item> Map::GetItem(short uid)
{
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == uid)
		{
			return item;
		}
	}

	return std::shared_ptr<Map_Item>();
}